

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

CompressionFunction *
duckdb::BitpackingFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  code *pcVar2;
  InternalException *this;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  undefined7 in_register_00000031;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  code *pcVar13;
  string local_50;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
  case 3:
    pcVar2 = BitpackingGetSegmentInfo<signed_char>;
    pcVar3 = BitpackingSkip<signed_char>;
    pcVar4 = BitpackingFetchRow<signed_char>;
    pcVar6 = BitpackingScanPartial<signed_char,signed_char,unsigned_char>;
    pcVar7 = BitpackingScan<signed_char>;
    pcVar8 = BitpackingInitScan<signed_char>;
    pcVar9 = BitpackingFinalizeCompress<signed_char,true>;
    pcVar5 = BitpackingCompress<signed_char,true>;
    pcVar12 = BitpackingInitCompression<signed_char,true>;
    pcVar13 = BitpackingFinalAnalyze<signed_char>;
    pcVar10 = BitpackingAnalyze<signed_char>;
    pcVar11 = BitpackingInitAnalyze<signed_char>;
    break;
  case 2:
    pcVar2 = BitpackingGetSegmentInfo<unsigned_char>;
    pcVar3 = BitpackingSkip<unsigned_char>;
    pcVar4 = BitpackingFetchRow<unsigned_char>;
    pcVar6 = BitpackingScanPartial<unsigned_char,signed_char,unsigned_char>;
    pcVar7 = BitpackingScan<unsigned_char>;
    pcVar8 = BitpackingInitScan<unsigned_char>;
    pcVar9 = BitpackingFinalizeCompress<unsigned_char,true>;
    pcVar5 = BitpackingCompress<unsigned_char,true>;
    pcVar12 = BitpackingInitCompression<unsigned_char,true>;
    pcVar13 = BitpackingFinalAnalyze<unsigned_char>;
    pcVar10 = BitpackingAnalyze<unsigned_char>;
    pcVar11 = BitpackingInitAnalyze<unsigned_char>;
    break;
  case 4:
    pcVar2 = BitpackingGetSegmentInfo<unsigned_short>;
    pcVar3 = BitpackingSkip<unsigned_short>;
    pcVar4 = BitpackingFetchRow<unsigned_short>;
    pcVar6 = BitpackingScanPartial<unsigned_short,short,unsigned_short>;
    pcVar7 = BitpackingScan<unsigned_short>;
    pcVar8 = BitpackingInitScan<unsigned_short>;
    pcVar9 = BitpackingFinalizeCompress<unsigned_short,true>;
    pcVar5 = BitpackingCompress<unsigned_short,true>;
    pcVar12 = BitpackingInitCompression<unsigned_short,true>;
    pcVar13 = BitpackingFinalAnalyze<unsigned_short>;
    pcVar10 = BitpackingAnalyze<unsigned_short>;
    pcVar11 = BitpackingInitAnalyze<unsigned_short>;
    break;
  case 5:
    pcVar2 = BitpackingGetSegmentInfo<short>;
    pcVar3 = BitpackingSkip<short>;
    pcVar4 = BitpackingFetchRow<short>;
    pcVar6 = BitpackingScanPartial<short,short,unsigned_short>;
    pcVar7 = BitpackingScan<short>;
    pcVar8 = BitpackingInitScan<short>;
    pcVar9 = BitpackingFinalizeCompress<short,true>;
    pcVar5 = BitpackingCompress<short,true>;
    pcVar12 = BitpackingInitCompression<short,true>;
    pcVar13 = BitpackingFinalAnalyze<short>;
    pcVar10 = BitpackingAnalyze<short>;
    pcVar11 = BitpackingInitAnalyze<short>;
    break;
  case 6:
    pcVar2 = BitpackingGetSegmentInfo<unsigned_int>;
    pcVar3 = BitpackingSkip<unsigned_int>;
    pcVar4 = BitpackingFetchRow<unsigned_int>;
    pcVar6 = BitpackingScanPartial<unsigned_int,int,unsigned_int>;
    pcVar7 = BitpackingScan<unsigned_int>;
    pcVar8 = BitpackingInitScan<unsigned_int>;
    pcVar9 = BitpackingFinalizeCompress<unsigned_int,true>;
    pcVar5 = BitpackingCompress<unsigned_int,true>;
    pcVar12 = BitpackingInitCompression<unsigned_int,true>;
    pcVar13 = BitpackingFinalAnalyze<unsigned_int>;
    pcVar10 = BitpackingAnalyze<unsigned_int>;
    pcVar11 = BitpackingInitAnalyze<unsigned_int>;
    break;
  case 7:
    pcVar2 = BitpackingGetSegmentInfo<int>;
    pcVar3 = BitpackingSkip<int>;
    pcVar4 = BitpackingFetchRow<int>;
    pcVar6 = BitpackingScanPartial<int,int,unsigned_int>;
    pcVar7 = BitpackingScan<int>;
    pcVar8 = BitpackingInitScan<int>;
    pcVar9 = BitpackingFinalizeCompress<int,true>;
    pcVar5 = BitpackingCompress<int,true>;
    pcVar12 = BitpackingInitCompression<int,true>;
    pcVar13 = BitpackingFinalAnalyze<int>;
    pcVar10 = BitpackingAnalyze<int>;
    pcVar11 = BitpackingInitAnalyze<int>;
    break;
  case 8:
    pcVar9 = BitpackingFinalizeCompress<unsigned_long,true>;
    pcVar5 = BitpackingCompress<unsigned_long,true>;
    pcVar12 = BitpackingInitCompression<unsigned_long,true>;
    goto LAB_01062020;
  case 9:
    pcVar2 = BitpackingGetSegmentInfo<long>;
    pcVar3 = BitpackingSkip<long>;
    pcVar4 = BitpackingFetchRow<long>;
    pcVar6 = BitpackingScanPartial<long,long,unsigned_long>;
    pcVar7 = BitpackingScan<long>;
    pcVar8 = BitpackingInitScan<long>;
    pcVar9 = BitpackingFinalizeCompress<long,true>;
    pcVar5 = BitpackingCompress<long,true>;
    pcVar12 = BitpackingInitCompression<long,true>;
    pcVar13 = BitpackingFinalAnalyze<long>;
    pcVar10 = BitpackingAnalyze<long>;
    pcVar11 = BitpackingInitAnalyze<long>;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
switchD_01061d14_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unsupported type for Bitpacking","");
    InternalException::InternalException(this,&local_50);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x17:
    pcVar9 = BitpackingFinalizeCompress<unsigned_long,false>;
    pcVar5 = BitpackingCompress<unsigned_long,false>;
    pcVar12 = BitpackingInitCompression<unsigned_long,false>;
LAB_01062020:
    pcVar8 = BitpackingInitScan<unsigned_long>;
    pcVar7 = BitpackingScan<unsigned_long>;
    pcVar6 = BitpackingScanPartial<unsigned_long,long,unsigned_long>;
    pcVar4 = BitpackingFetchRow<unsigned_long>;
    pcVar3 = BitpackingSkip<unsigned_long>;
    pcVar2 = BitpackingGetSegmentInfo<unsigned_long>;
    pcVar13 = BitpackingFinalAnalyze<unsigned_long>;
    pcVar10 = BitpackingAnalyze<unsigned_long>;
    pcVar11 = BitpackingInitAnalyze<unsigned_long>;
    break;
  default:
    if (iVar1 == 0xcb) {
      pcVar2 = BitpackingGetSegmentInfo<duckdb::uhugeint_t>;
      pcVar3 = BitpackingSkip<duckdb::uhugeint_t>;
      pcVar4 = BitpackingFetchRow<duckdb::uhugeint_t>;
      pcVar6 = BitpackingScanPartial<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>;
      pcVar7 = BitpackingScan<duckdb::uhugeint_t>;
      pcVar8 = BitpackingInitScan<duckdb::uhugeint_t>;
      pcVar9 = BitpackingFinalizeCompress<duckdb::uhugeint_t,true>;
      pcVar5 = BitpackingCompress<duckdb::uhugeint_t,true>;
      pcVar12 = BitpackingInitCompression<duckdb::uhugeint_t,true>;
      pcVar13 = BitpackingFinalAnalyze<duckdb::uhugeint_t>;
      pcVar10 = BitpackingAnalyze<duckdb::uhugeint_t>;
      pcVar11 = BitpackingInitAnalyze<duckdb::uhugeint_t>;
    }
    else {
      if (iVar1 != 0xcc) goto switchD_01061d14_caseD_a;
      pcVar2 = BitpackingGetSegmentInfo<duckdb::hugeint_t>;
      pcVar3 = BitpackingSkip<duckdb::hugeint_t>;
      pcVar4 = BitpackingFetchRow<duckdb::hugeint_t>;
      pcVar6 = BitpackingScanPartial<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>;
      pcVar7 = BitpackingScan<duckdb::hugeint_t>;
      pcVar8 = BitpackingInitScan<duckdb::hugeint_t>;
      pcVar9 = BitpackingFinalizeCompress<duckdb::hugeint_t,true>;
      pcVar5 = BitpackingCompress<duckdb::hugeint_t,true>;
      pcVar12 = BitpackingInitCompression<duckdb::hugeint_t,true>;
      pcVar13 = BitpackingFinalAnalyze<duckdb::hugeint_t>;
      pcVar10 = BitpackingAnalyze<duckdb::hugeint_t>;
      pcVar11 = BitpackingInitAnalyze<duckdb::hugeint_t>;
    }
  }
  __return_storage_ptr__->type = COMPRESSION_BITPACKING;
  __return_storage_ptr__->data_type = type;
  __return_storage_ptr__->init_analyze = pcVar11;
  __return_storage_ptr__->analyze = pcVar10;
  __return_storage_ptr__->final_analyze = pcVar13;
  __return_storage_ptr__->init_compression = pcVar12;
  __return_storage_ptr__->compress = pcVar5;
  __return_storage_ptr__->compress_finalize = pcVar9;
  __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
  __return_storage_ptr__->init_scan = pcVar8;
  __return_storage_ptr__->scan_vector = pcVar7;
  __return_storage_ptr__->scan_partial = pcVar6;
  __return_storage_ptr__->select = (compression_select_t)0x0;
  __return_storage_ptr__->filter = (compression_filter_t)0x0;
  __return_storage_ptr__->fetch_row = pcVar4;
  __return_storage_ptr__->skip = pcVar3;
  __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
  __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
  __return_storage_ptr__->append = (compression_append_t)0x0;
  __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
  __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
  __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
  __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
  __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
  __return_storage_ptr__->get_segment_info = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction BitpackingFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return GetBitpackingFunction<int8_t>(type);
	case PhysicalType::INT16:
		return GetBitpackingFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetBitpackingFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetBitpackingFunction<int64_t>(type);
	case PhysicalType::UINT8:
		return GetBitpackingFunction<uint8_t>(type);
	case PhysicalType::UINT16:
		return GetBitpackingFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetBitpackingFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetBitpackingFunction<uint64_t>(type);
	case PhysicalType::INT128:
		return GetBitpackingFunction<hugeint_t>(type);
	case PhysicalType::UINT128:
		return GetBitpackingFunction<uhugeint_t>(type);
	case PhysicalType::LIST:
		return GetBitpackingFunction<uint64_t, false>(type);
	default:
		throw InternalException("Unsupported type for Bitpacking");
	}
}